

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

char * cmState::GetTargetTypeName(TargetType targetType)

{
  char *pcStack_10;
  TargetType targetType_local;
  
  switch(targetType) {
  case EXECUTABLE:
    pcStack_10 = "EXECUTABLE";
    break;
  case STATIC_LIBRARY:
    pcStack_10 = "STATIC_LIBRARY";
    break;
  case SHARED_LIBRARY:
    pcStack_10 = "SHARED_LIBRARY";
    break;
  case MODULE_LIBRARY:
    pcStack_10 = "MODULE_LIBRARY";
    break;
  case OBJECT_LIBRARY:
    pcStack_10 = "OBJECT_LIBRARY";
    break;
  case UTILITY:
    pcStack_10 = "UTILITY";
    break;
  case GLOBAL_TARGET:
    pcStack_10 = "GLOBAL_TARGET";
    break;
  case INTERFACE_LIBRARY:
    pcStack_10 = "INTERFACE_LIBRARY";
    break;
  case UNKNOWN_LIBRARY:
    pcStack_10 = "UNKNOWN_LIBRARY";
    break;
  default:
    __assert_fail("0 && \"Unexpected target type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x80,"static const char *cmState::GetTargetTypeName(cmState::TargetType)");
  }
  return pcStack_10;
}

Assistant:

const char* cmState::GetTargetTypeName(cmState::TargetType targetType)
{
  switch( targetType )
    {
      case cmState::STATIC_LIBRARY:
        return "STATIC_LIBRARY";
      case cmState::MODULE_LIBRARY:
        return "MODULE_LIBRARY";
      case cmState::SHARED_LIBRARY:
        return "SHARED_LIBRARY";
      case cmState::OBJECT_LIBRARY:
        return "OBJECT_LIBRARY";
      case cmState::EXECUTABLE:
        return "EXECUTABLE";
      case cmState::UTILITY:
        return "UTILITY";
      case cmState::GLOBAL_TARGET:
        return "GLOBAL_TARGET";
      case cmState::INTERFACE_LIBRARY:
        return "INTERFACE_LIBRARY";
      case cmState::UNKNOWN_LIBRARY:
        return "UNKNOWN_LIBRARY";
    }
  assert(0 && "Unexpected target type");
  return 0;
}